

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPG.cpp
# Opt level: O0

void writeCompressData(iostream *outFile,JPG *jpg)

{
  uint uVar1;
  MCU *pMVar2;
  byte bVar3;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  Block **ppaiVar8;
  Block *paiVar9;
  ostream *poVar10;
  HuffmanTable *pHVar11;
  runtime_error *this;
  uint rowBit_1;
  uint uStack_c0;
  byte lengthOfCoefficient;
  int currentValue;
  uint k_1;
  uint numZero;
  HuffmanTable *acTable;
  uint rowBit;
  uint magnitude;
  int difference;
  HuffmanTable *dcTable;
  uint local_90;
  uint uStack_8c;
  byte symbol;
  uint q;
  uint k;
  Block *currentBlock;
  uint jj;
  uint local_70;
  uint local_6c;
  uint ii;
  uint componentID;
  MCU *currentMCU;
  uint j;
  uint i;
  int lastDC [4];
  ByteWriter writer;
  JPG *jpg_local;
  iostream *outFile_local;
  
  ByteWriter::ByteWriter((ByteWriter *)(lastDC + 2),outFile);
  memset(&j,0,0x10);
  currentMCU._4_4_ = 0;
  do {
    if (jpg->mcuHeight <= currentMCU._4_4_) {
      ByteWriter::flush((ByteWriter *)(lastDC + 2));
      poVar10 = (ostream *)
                std::ostream::operator<<
                          (&std::cout,
                           (uint)writer.bytes.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
      poVar10 = std::operator<<(poVar10," bytes written to the compressed data");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      ByteWriter::~ByteWriter((ByteWriter *)(lastDC + 2));
      return;
    }
    for (currentMCU._0_4_ = 0; (uint)currentMCU < jpg->mcuWidth;
        currentMCU._0_4_ = (uint)currentMCU + 1) {
      pMVar2 = jpg->data;
      uVar1 = jpg->mcuWidth;
      for (local_6c = 1; local_6c < 4; local_6c = local_6c + 1) {
        for (local_70 = 0; uVar6 = JPG::getVerticalSamplingFrequency(jpg,local_6c), local_70 < uVar6
            ; local_70 = local_70 + 1) {
          for (currentBlock._0_4_ = 0; uVar6 = JPG::getHorizontalSamplingFrequency(jpg,local_6c),
              (uint)currentBlock < uVar6; currentBlock._0_4_ = (uint)currentBlock + 1) {
            ppaiVar8 = MCU::operator[](pMVar2 + (currentMCU._4_4_ * uVar1 + (uint)currentMCU),
                                       local_6c);
            paiVar9 = *ppaiVar8;
            uVar6 = JPG::getHorizontalSamplingFrequency(jpg,local_6c);
            paiVar9 = paiVar9 + (local_70 * uVar6 + (uint)currentBlock);
            std::operator<<((ostream *)&std::cout,"Block\n");
            for (uStack_8c = 0; uStack_8c < 8; uStack_8c = uStack_8c + 1) {
              for (local_90 = 0; local_90 < 8; local_90 = local_90 + 1) {
                if (-1 < (*paiVar9)[uStack_8c * 8 + local_90]) {
                  std::operator<<((ostream *)&std::cout," ");
                }
                poVar10 = (ostream *)
                          std::ostream::operator<<(&std::cout,(*paiVar9)[local_90 + uStack_8c * 8]);
                std::operator<<(poVar10," ");
              }
              std::operator<<((ostream *)&std::cout,"\n");
            }
            pHVar11 = JPG::getHuffmanDCTable(jpg,local_6c);
            iVar7 = (*paiVar9)[0] - (&j)[local_6c];
            (&j)[local_6c] = (*paiVar9)[0];
            bVar3 = getBinaryLengthByValue(iVar7);
            ByteWriter::writeBit
                      ((ByteWriter *)(lastDC + 2),pHVar11->codeOfSymbol[bVar3],
                       pHVar11->codeLengthOfSymbol[bVar3]);
            if (bVar3 != 0) {
              uVar6 = getRawBit(iVar7,(uint)bVar3);
              ByteWriter::writeBit((ByteWriter *)(lastDC + 2),uVar6,(uint)bVar3);
            }
            pHVar11 = JPG::getHuffmanACTable(jpg,local_6c);
            currentValue = 0;
            for (uStack_c0 = 1; uStack_c0 < 0x40; uStack_c0 = uStack_c0 + 1) {
              iVar7 = (*paiVar9)[""[uStack_c0]];
              if (iVar7 == 0) {
                if (uStack_c0 == 0x3f) {
                  ByteWriter::writeBit
                            ((ByteWriter *)(lastDC + 2),pHVar11->codeOfSymbol[0],
                             pHVar11->codeLengthOfSymbol[0]);
                  break;
                }
                currentValue = currentValue + 1;
                if (currentValue == 0x10) {
                  bVar4 = isRemainingAllZero(paiVar9,uStack_c0 + 1);
                  if (bVar4) {
                    ByteWriter::writeBit
                              ((ByteWriter *)(lastDC + 2),pHVar11->codeOfSymbol[0],
                               pHVar11->codeLengthOfSymbol[0]);
                    break;
                  }
                  ByteWriter::writeBit
                            ((ByteWriter *)(lastDC + 2),pHVar11->codeOfSymbol[0xf0],
                             pHVar11->codeLengthOfSymbol[0xf0]);
                  currentValue = 0;
                }
              }
              else {
                bVar3 = getBinaryLengthByValue(iVar7);
                bVar5 = (char)(currentValue << 4) + bVar3;
                if (pHVar11->codeLengthOfSymbol[bVar5] == 0) {
                  this = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(this,"Error -find error");
                  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                  ;
                }
                ByteWriter::writeBit
                          ((ByteWriter *)(lastDC + 2),pHVar11->codeOfSymbol[bVar5],
                           pHVar11->codeLengthOfSymbol[bVar5]);
                uVar6 = getRawBit(iVar7,(uint)bVar3);
                ByteWriter::writeBit((ByteWriter *)(lastDC + 2),uVar6,(uint)bVar3);
                currentValue = 0;
              }
            }
          }
        }
      }
    }
    currentMCU._4_4_ = currentMCU._4_4_ + 1;
  } while( true );
}

Assistant:

void writeCompressData(std::iostream& outFile, const JPG& jpg) {
    ByteWriter writer(outFile);
    int lastDC[4] = { 0 };
    for (uint i = 0; i < jpg.mcuHeight; i++) {
        for (uint j = 0; j < jpg.mcuWidth; j++) {
            MCU& currentMCU = jpg.data[i * jpg.mcuWidth + j];
            //iterate over 每一个component Y, cb cr
            for(uint componentID = 1; componentID <= 3; componentID++) {
                for(uint ii = 0; ii < jpg.getVerticalSamplingFrequency(componentID); ii++) {
                    for(uint jj = 0; jj < jpg.getHorizontalSamplingFrequency(componentID); jj++) {

                        Block& currentBlock = currentMCU[componentID][ii * jpg.getHorizontalSamplingFrequency(componentID) + jj];
                        std::cout << "Block\n";
                        for(uint k = 0; k < 8; k++) {
                            for(uint q = 0; q < 8; q++) {
                                if(currentBlock[k * 8 + q] >= 0)
                                    std::cout << " ";
                                std::cout << currentBlock[k * 8 + q] << " ";
                            }
                            std::cout << "\n";
                        }
                        
                        byte symbol;
                        //先写DC分量
                        const HuffmanTable& dcTable = jpg.getHuffmanDCTable(componentID);
                        int difference = currentBlock[0] - lastDC[componentID]; //DC分量是encode difference
                        lastDC[componentID] = currentBlock[0];

                        //对于DC来说symbol 就是length
                        symbol = getBinaryLengthByValue(difference); //Y的2进制的长度就是symbol的值// 
                        uint magnitude = symbol;
                        writer.writeBit(dcTable.codeOfSymbol[symbol], dcTable.codeLengthOfSymbol[symbol]);
                        if(magnitude != 0) { //长度不为0的话，需要把row bit 写进去
                            uint rowBit = getRawBit(difference, symbol);
                            writer.writeBit(rowBit, magnitude);
                        }
                        
                        //write raw bits;
                        //写AC分量
                        const HuffmanTable& acTable = jpg.getHuffmanACTable(componentID);
                        uint numZero = 0;
                        for(uint k = 1; k < 64; k++) {
                            int currentValue = currentBlock[ZIG_ZAG[k]];
                            if(currentValue == 0) {
                                if(k == 63) {
                                    symbol = 0x00;
                                    writer.writeBit(acTable.codeOfSymbol[symbol], acTable.codeLengthOfSymbol[symbol]);
                                    break;
                                }
                                numZero++;
                                if(numZero == 16) {
                                    if(isRemainingAllZero(currentBlock, k + 1)) {
                                        symbol = 0x00;
                                        writer.writeBit(acTable.codeOfSymbol[symbol], acTable.codeLengthOfSymbol[symbol]);
                                        break;
                                    } else {
                                        symbol = 0xF0;
                                        writer.writeBit(acTable.codeOfSymbol[symbol], acTable.codeLengthOfSymbol[symbol]);
                                        numZero = 0;
                                    }
                                }
                            } else {
                                byte lengthOfCoefficient = getBinaryLengthByValue(currentValue);
                                symbol = (numZero << 4) + lengthOfCoefficient;
                                if(acTable.codeLengthOfSymbol[symbol] == 0) {
                                    throw std::runtime_error("Error -find error");
                                }
                                writer.writeBit(acTable.codeOfSymbol[symbol], acTable.codeLengthOfSymbol[symbol]);
                                uint rowBit = getRawBit(currentValue, lengthOfCoefficient);
                                //write raw bits;
                                writer.writeBit(rowBit, lengthOfCoefficient);
                                numZero = 0;
                            }
                        }

                    }
                }
            }
        }
    }
    writer.flush();
    std::cout <<writer.bytesWritten << " bytes written to the compressed data"<< std::endl;
}